

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O1

void __thiscall Fl_Widget_Type::redraw(Fl_Widget_Type *this)

{
  Fl_Type *pFVar1;
  Fl_Type *pFVar2;
  int iVar3;
  
  iVar3 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1e])();
  if (iVar3 == 0) {
    pFVar1 = (this->super_Fl_Type).parent;
    if (pFVar1 != (Fl_Type *)0x0) {
      iVar3 = (*pFVar1->_vptr_Fl_Type[0x17])();
      if (iVar3 != 0) {
        pFVar1 = &this->super_Fl_Type;
        do {
          this = (Fl_Widget_Type *)pFVar1->parent;
          pFVar2 = (this->super_Fl_Type).parent;
          if (pFVar2 == (Fl_Type *)0x0) break;
          pFVar1 = &this->super_Fl_Type;
          iVar3 = (*pFVar2->_vptr_Fl_Type[0x17])();
        } while (iVar3 != 0);
      }
    }
    Fl_Widget::redraw(this->o);
    return;
  }
  do {
    this = (Fl_Widget_Type *)(this->super_Fl_Type).parent;
    if (this == (Fl_Widget_Type *)0x0) break;
    iVar3 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1e])(this);
  } while (iVar3 != 0);
  (*(this->super_Fl_Type)._vptr_Fl_Type[8])(this,0,0);
  return;
}

Assistant:

void Fl_Widget_Type::redraw() {
  Fl_Type *t = this;
  if (is_menu_item()) {
    // find the menu button that parents this menu:
    do t = t->parent; while (t && t->is_menu_item());
    // kludge to cause build_menu to be called again:
    t->add_child(0,0);
  } else {
    while (t->parent && t->parent->is_widget()) t = t->parent;
    ((Fl_Widget_Type*)t)->o->redraw();
  }
}